

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O0

bool __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::get_peers
          (dht_default_storage *this,sha1_hash *info_hash,bool noseed,bool scrape,address *requester
          ,entry *peers)

{
  vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
  *pvVar1;
  iterator iVar2;
  pointer *this_00;
  const_iterator cVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  pointer ppVar7;
  ulong uVar8;
  entry *peVar9;
  const_iterator __first;
  const_iterator __last;
  difference_type dVar10;
  uint *puVar11;
  long lVar12;
  reference this_01;
  size_type sVar13;
  pointer ppVar14;
  aux *this_02;
  bool local_485;
  bool local_469;
  address local_420;
  __normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
  local_400;
  peer_entry *local_3f8;
  __normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
  local_3f0;
  __normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
  local_3e8;
  __normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
  requester_iter;
  peer_entry requester_entry;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  iterator out;
  string *str;
  const_iterator iter;
  uint local_37c;
  undefined1 auStack_378 [4];
  int candidates;
  list_type *local_368;
  list_type *pe;
  tcp local_358;
  int to_pick;
  undefined1 auStack_350 [4];
  tcp protocol;
  string local_340;
  string_view local_320;
  string local_310;
  address local_2f0;
  undefined1 local_2cc [8];
  sha1_hash iphash;
  peer_entry *p;
  const_iterator __end4;
  const_iterator __begin4;
  vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
  *__range4;
  bloom_filter<256> seeds;
  bloom_filter<256> downloaders;
  string_view local_88;
  string_type local_78;
  pointer *local_58;
  vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
  *peersv;
  torrent_entry *v;
  _Self local_40;
  const_iterator i;
  entry *peers_local;
  address *requester_local;
  bool scrape_local;
  bool noseed_local;
  sha1_hash *info_hash_local;
  dht_default_storage *this_local;
  
  i._M_node = (_Base_ptr)peers;
  local_40._M_node =
       (_Base_ptr)
       ::std::
       map<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::torrent_entry,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::torrent_entry>_>_>
       ::find(&this->m_map,info_hash);
  v = (torrent_entry *)
      ::std::
      map<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::torrent_entry,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::torrent_entry>_>_>
      ::end(&this->m_map);
  bVar4 = ::std::operator==(&local_40,(_Self *)&v);
  if (bVar4) {
    sVar6 = ::std::
            map<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::torrent_entry,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::torrent_entry>_>_>
            ::size(&this->m_map);
    iVar5 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x408c);
    this_local._7_1_ = iVar5 <= (int)sVar6;
  }
  else {
    ppVar7 = ::std::
             _Rb_tree_const_iterator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::torrent_entry>_>
             ::operator->(&local_40);
    peersv = (vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
              *)&ppVar7->second;
    bVar4 = boost::asio::ip::address::is_v4(requester);
    if (bVar4) {
      pvVar1 = peersv + 1;
    }
    else {
      pvVar1 = peersv + 2;
    }
    local_58 = &(pvVar1->
                super__Vector_base<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    uVar8 = ::std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      ::std::__cxx11::string::string((string *)&local_78,(string *)peersv);
      cVar3 = i;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"n");
      peVar9 = entry::operator[]((entry *)cVar3._M_node,local_88);
      entry::operator=(peVar9,&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
    }
    if (scrape) {
      libtorrent::aux::bloom_filter<256>::bloom_filter((bloom_filter<256> *)(seeds.bits + 0xf8));
      libtorrent::aux::bloom_filter<256>::bloom_filter((bloom_filter<256> *)((long)&__range4 + 4));
      this_00 = local_58;
      __end4 = ::std::
               vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
               ::begin((vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
                        *)local_58);
      p = (peer_entry *)
          ::std::
          vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
          ::end((vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
                 *)this_00);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
                                         *)&p), bVar4) {
        iphash.m_number._M_elems._12_8_ =
             __gnu_cxx::
             __normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
             ::operator*(&__end4);
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                  (&local_2f0,&((reference)iphash.m_number._M_elems._12_8_)->addr);
        libtorrent::aux::hash_address((sha1_hash *)local_2cc,&local_2f0);
        if ((*(byte *)(iphash.m_number._M_elems._12_8_ + 0x24) & 1) == 0) {
          libtorrent::aux::bloom_filter<256>::set
                    ((bloom_filter<256> *)(seeds.bits + 0xf8),(sha1_hash *)local_2cc);
        }
        else {
          libtorrent::aux::bloom_filter<256>::set
                    ((bloom_filter<256> *)((long)&__range4 + 4),(sha1_hash *)local_2cc);
        }
        __gnu_cxx::
        __normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
        ::operator++(&__end4);
      }
      libtorrent::aux::bloom_filter<256>::to_string_abi_cxx11_
                (&local_310,(bloom_filter<256> *)(seeds.bits + 0xf8));
      cVar3 = i;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_320,"BFpe");
      peVar9 = entry::operator[]((entry *)cVar3._M_node,local_320);
      entry::operator=(peVar9,&local_310);
      ::std::__cxx11::string::~string((string *)&local_310);
      libtorrent::aux::bloom_filter<256>::to_string_abi_cxx11_
                (&local_340,(bloom_filter<256> *)((long)&__range4 + 4));
      cVar3 = i;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_350,"BFsd");
      peVar9 = entry::operator[]((entry *)cVar3._M_node,_auStack_350);
      entry::operator=(peVar9,&local_340);
      ::std::__cxx11::string::~string((string *)&local_340);
    }
    else {
      bVar4 = boost::asio::ip::address::is_v4(requester);
      if (bVar4) {
        local_358 = boost::asio::ip::tcp::v4();
      }
      else {
        local_358 = boost::asio::ip::tcp::v6();
      }
      tcp::tcp((tcp *)&to_pick,&local_358);
      pe._4_4_ = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x4089);
      bVar4 = ::std::
              vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
              ::empty((vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
                       *)local_58);
      local_469 = false;
      if (!bVar4) {
        pe._0_4_ = boost::asio::ip::tcp::v6();
        local_469 = boost::asio::ip::operator==((tcp *)&to_pick,(tcp *)&pe);
      }
      cVar3._M_node = i._M_node;
      if (local_469 != false) {
        pe._4_4_ = (int)pe._4_4_ / 4;
      }
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_378,"values");
      peVar9 = entry::operator[]((entry *)cVar3._M_node,_auStack_378);
      local_368 = entry::list(peVar9);
      __first = ::std::
                vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
                ::begin((vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
                         *)local_58);
      __last = ::std::
               vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
               ::end((vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
                      *)local_58);
      iter._M_current._7_1_ = noseed;
      dVar10 = ::std::
               count_if<__gnu_cxx::__normal_iterator<libtorrent::dht::(anonymous_namespace)::peer_entry_const*,std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>>>,libtorrent::dht::(anonymous_namespace)::dht_default_storage::get_peers(libtorrent::digest32<160l>const&,bool,bool,boost::asio::ip::address_const&,libtorrent::entry&)const::_lambda(libtorrent::dht::(anonymous_namespace)::peer_entry_const&)_1_>
                         ((__normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
                           )__first._M_current,
                          (__normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
                           )__last._M_current,(anon_class_1_1_632b04f0_for__M_pred)noseed);
      local_37c = (uint)dVar10;
      puVar11 = (uint *)::std::min<int>((int *)((long)&pe + 4),(int *)&local_37c);
      pe._4_4_ = *puVar11;
      str = (string *)
            ::std::
            vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
            ::begin((vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
                     *)local_58);
      while (0 < (int)pe._4_4_) {
        if ((!noseed) ||
           (ppVar14 = __gnu_cxx::
                      __normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
                      ::operator->((__normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
                                    *)&str), (ppVar14->seed & 1U) == 0)) {
          this_02 = (aux *)(ulong)local_37c;
          local_37c = local_37c - 1;
          lVar12 = libtorrent::aux::random(this_02);
          if ((uint)lVar12 <= pe._4_4_) {
            ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::emplace_back<>
                      (local_368);
            this_01 = ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::back
                                (local_368);
            out._M_current = (char *)entry::string_abi_cxx11_(this_01);
            ::std::__cxx11::string::resize((ulong)out._M_current);
            local_3b0._M_current = (char *)::std::__cxx11::string::begin();
            ppVar14 = __gnu_cxx::
                      __normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
                      ::operator->((__normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
                                    *)&str);
            libtorrent::aux::
            write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&>
                      (&ppVar14->addr,&local_3b0);
            iVar2 = out;
            requester_entry._32_8_ = ::std::__cxx11::string::begin();
            __gnu_cxx::operator-
                      (&local_3b0,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)((long)&requester_entry.addr.impl_.data_ + 0x18));
            ::std::__cxx11::string::resize((ulong)iVar2._M_current);
            pe._4_4_ = pe._4_4_ - 1;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
        ::operator++((__normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
                      *)&str);
      }
    }
    sVar13 = ::std::
             vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
             ::size((vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
                     *)local_58);
    iVar5 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x408e);
    if ((int)sVar13 < iVar5) {
      this_local._7_1_ = false;
    }
    else {
      peer_entry::peer_entry((peer_entry *)&requester_iter);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                ((basic_endpoint<boost::asio::ip::tcp> *)&requester_entry,requester);
      local_3f0._M_current =
           (peer_entry *)
           ::std::
           vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
           ::begin((vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
                    *)local_58);
      local_3f8 = (peer_entry *)
                  ::std::
                  vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
                  ::end((vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
                         *)local_58);
      local_3e8 = ::std::
                  lower_bound<__gnu_cxx::__normal_iterator<libtorrent::dht::(anonymous_namespace)::peer_entry_const*,std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>>>,libtorrent::dht::(anonymous_namespace)::peer_entry>
                            (local_3f0,
                             (__normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
                              )local_3f8,(peer_entry *)&requester_iter);
      local_400._M_current =
           (peer_entry *)
           ::std::
           vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
           ::end((vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>
                  *)local_58);
      bVar4 = __gnu_cxx::operator==(&local_3e8,&local_400);
      local_485 = true;
      if (!bVar4) {
        ppVar14 = __gnu_cxx::
                  __normal_iterator<const_libtorrent::dht::(anonymous_namespace)::peer_entry_*,_std::vector<libtorrent::dht::(anonymous_namespace)::peer_entry,_std::allocator<libtorrent::dht::(anonymous_namespace)::peer_entry>_>_>
                  ::operator->(&local_3e8);
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&local_420,&ppVar14->addr);
        local_485 = boost::asio::ip::operator!=(&local_420,requester);
      }
      this_local._7_1_ = local_485;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool get_peers(sha1_hash const& info_hash
			, bool const noseed, bool const scrape, address const& requester
			, entry& peers) const override
		{
			auto const i = m_map.find(info_hash);
			if (i == m_map.end()) return int(m_map.size()) >= m_settings.get_int(settings_pack::dht_max_torrents);

			torrent_entry const& v = i->second;
			auto const& peersv = requester.is_v4() ? v.peers4 : v.peers6;

			if (!v.name.empty()) peers["n"] = v.name;

			if (scrape)
			{
				aux::bloom_filter<256> downloaders;
				aux::bloom_filter<256> seeds;

				for (auto const& p : peersv)
				{
					sha1_hash const iphash = aux::hash_address(p.addr.address());
					if (p.seed) seeds.set(iphash);
					else downloaders.set(iphash);
				}

				peers["BFpe"] = downloaders.to_string();
				peers["BFsd"] = seeds.to_string();
			}
			else
			{
				tcp const protocol = requester.is_v4() ? tcp::v4() : tcp::v6();
				int to_pick = m_settings.get_int(settings_pack::dht_max_peers_reply);
				TORRENT_ASSERT(to_pick >= 0);
				// if these are IPv6 peers their addresses are 4x the size of IPv4
				// so reduce the max peers 4 fold to compensate
				// max_peers_reply should probably be specified in bytes
				if (!peersv.empty() && protocol == tcp::v6())
					to_pick /= 4;
				entry::list_type& pe = peers["values"].list();

				int candidates = int(std::count_if(peersv.begin(), peersv.end()
					, [=](peer_entry const& e) { return !(noseed && e.seed); }));

				to_pick = std::min(to_pick, candidates);

				for (auto iter = peersv.begin(); to_pick > 0; ++iter)
				{
					// if the node asking for peers is a seed, skip seeds from the
					// peer list
					if (noseed && iter->seed) continue;

					TORRENT_ASSERT(candidates >= to_pick);

					// pick this peer with probability
					// <peers left to pick> / <peers left in the set>
					if (aux::random(std::uint32_t(candidates--)) > std::uint32_t(to_pick))
						continue;

					pe.emplace_back();
					std::string& str = pe.back().string();

					str.resize(18);
					std::string::iterator out = str.begin();
					aux::write_endpoint(iter->addr, out);
					str.resize(std::size_t(out - str.begin()));

					--to_pick;
				}
			}

			if (int(peersv.size()) < m_settings.get_int(settings_pack::dht_max_peers))
				return false;

			// we're at the max peers stored for this torrent
			// only send a write token if the requester is already in the set
			// only check for a match on IP because the peer may be announcing
			// a different port than the one it is using to send DHT messages
			peer_entry requester_entry;
			requester_entry.addr.address(requester);
			auto requester_iter = std::lower_bound(peersv.begin(), peersv.end(), requester_entry);
			return requester_iter == peersv.end()
				|| requester_iter->addr.address() != requester;
		}